

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

SmallVector<spirv_cross::SPIRBlock::Case,_8UL> * __thiscall
spirv_cross::Compiler::get_case_list(Compiler *this,SPIRBlock *block)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRConstant *pSVar3;
  SPIRType *pSVar4;
  SPIRConstantOp *pSVar5;
  SPIRVariable *pSVar6;
  SPIRUndef *pSVar7;
  CompilerError *this_00;
  pointer pvVar8;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>,_true>
  local_78;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>,_true>
  local_70;
  const_iterator search;
  SPIRType *type_3;
  SPIRUndef *undef;
  SPIRType *type_2;
  SPIRVariable *var;
  SPIRType *type_1;
  SPIRConstantOp *op;
  SPIRType *type;
  SPIRConstant *constant;
  uint32_t width;
  SPIRBlock *block_local;
  Compiler *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->condition);
  pSVar3 = maybe_get<spirv_cross::SPIRConstant>(this,uVar2);
  if (pSVar3 == (SPIRConstant *)0x0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->condition);
    pSVar5 = maybe_get<spirv_cross::SPIRConstantOp>(this,uVar2);
    if (pSVar5 == (SPIRConstantOp *)0x0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->condition);
      pSVar6 = maybe_get<spirv_cross::SPIRVariable>(this,uVar2);
      if (pSVar6 == (SPIRVariable *)0x0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->condition);
        pSVar7 = maybe_get<spirv_cross::SPIRUndef>(this,uVar2);
        if (pSVar7 == (SPIRUndef *)0x0) {
          local_70._M_cur =
               (__node_type *)
               ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>_>_>
               ::find(&(this->ir).load_type_width,&block->condition);
          local_78._M_cur =
               (__node_type *)
               ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>_>_>
               ::end(&(this->ir).load_type_width);
          bVar1 = ::std::__detail::operator==(&local_70,&local_78);
          if (bVar1) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (this_00,"Use of undeclared variable on a switch statement.");
            __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          pvVar8 = ::std::__detail::
                   _Node_const_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>,_false,_true>
                                 *)&local_70);
          constant._4_4_ = pvVar8->second;
        }
        else {
          uVar2 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(pSVar7->super_IVariant).field_0xc);
          pSVar4 = get<spirv_cross::SPIRType>(this,uVar2);
          constant._4_4_ = pSVar4->width;
        }
      }
      else {
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSVar6->super_IVariant).field_0xc);
        pSVar4 = get<spirv_cross::SPIRType>(this,uVar2);
        constant._4_4_ = pSVar4->width;
      }
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar5->basetype);
      pSVar4 = get<spirv_cross::SPIRType>(this,uVar2);
      constant._4_4_ = pSVar4->width;
    }
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar3->super_IVariant).field_0xc);
    pSVar4 = get<spirv_cross::SPIRType>(this,uVar2);
    constant._4_4_ = pSVar4->width;
  }
  if (constant._4_4_ < 0x21) {
    this_local = (Compiler *)&block->cases_32bit;
  }
  else {
    this_local = (Compiler *)&block->cases_64bit;
  }
  return (SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *)this_local;
}

Assistant:

const SmallVector<SPIRBlock::Case> &Compiler::get_case_list(const SPIRBlock &block) const
{
	uint32_t width = 0;

	// First we check if we can get the type directly from the block.condition
	// since it can be a SPIRConstant or a SPIRVariable.
	if (const auto *constant = maybe_get<SPIRConstant>(block.condition))
	{
		const auto &type = get<SPIRType>(constant->constant_type);
		width = type.width;
	}
	else if (const auto *op = maybe_get<SPIRConstantOp>(block.condition))
	{
		const auto &type = get<SPIRType>(op->basetype);
		width = type.width;
	}
	else if (const auto *var = maybe_get<SPIRVariable>(block.condition))
	{
		const auto &type = get<SPIRType>(var->basetype);
		width = type.width;
	}
	else if (const auto *undef = maybe_get<SPIRUndef>(block.condition))
	{
		const auto &type = get<SPIRType>(undef->basetype);
		width = type.width;
	}
	else
	{
		auto search = ir.load_type_width.find(block.condition);
		if (search == ir.load_type_width.end())
		{
			SPIRV_CROSS_THROW("Use of undeclared variable on a switch statement.");
		}

		width = search->second;
	}

	if (width > 32)
		return block.cases_64bit;

	return block.cases_32bit;
}